

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall format::missing_arg_error::~missing_arg_error(missing_arg_error *this)

{
  ~missing_arg_error(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

missing_arg_error (std::string arg, std::string msg="Argument missing")
   : std::runtime_error(msg)
   {
    arg_ = arg;
   }